

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
spirv_cross::
join<std::__cxx11::string,char_const(&)[8],char_const(&)[5],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[29],std::__cxx11::string,char_const(&)[4]>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [8],
          char (*ts_2) [5],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          char (*ts_4) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          char (*ts_6) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,
          char (*ts_8) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,
          char (*ts_10) [4],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11
          ,char (*ts_12) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_13,
          char (*ts_14) [29],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_15,char (*ts_16) [4]
          )

{
  StringStream<4096UL,_4096UL> stream;
  
  stream.saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.ptr =
       (Buffer *)&stream.saved_buffers.stack_storage;
  stream.current_buffer.size = 0;
  stream.current_buffer.buffer = (char *)0x0;
  stream.current_buffer.offset = 0;
  stream.saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
  buffer_size = 0;
  stream.saved_buffers.buffer_capacity = 8;
  StringStream<4096UL,_4096UL>::reset(&stream);
  StringStream<4096UL,_4096UL>::append(&stream,*(char **)this,*(size_t *)(this + 8));
  inner::
  join_helper<char_const(&)[8],char_const(&)[5],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[29],std::__cxx11::string,char_const(&)[4]>
            (&stream,(char (*) [8])ts,(char (*) [5])ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
             (char (*) [3])ts_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
             (char (*) [3])ts_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
             (char (*) [3])ts_7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_8,
             (char (*) [4])ts_9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_10,
             (char (*) [3])ts_11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_12,
             (char (*) [29])ts_13,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_14,
             (char (*) [4])ts_15);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,&stream);
  StringStream<4096UL,_4096UL>::~StringStream(&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}